

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O3

void __thiscall
HostVector_std_vector_constructor_Test::TestBody(HostVector_std_vector_constructor_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  value_type_conflict1 *__val;
  long lVar5;
  char *message;
  ulong uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  internal local_80 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  vector<int,_std::allocator<int>_> local_70;
  AssertHelper local_58;
  Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
  local_50 [8];
  void *local_48;
  ulong local_40;
  
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(0x28);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + 10;
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[0]
       = 0;
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[1]
       = 0;
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[2]
       = 0;
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[3]
       = 0;
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[4]
       = 0;
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[5]
       = 0;
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[6]
       = 0;
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[7]
       = 0;
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[8]
       = 0;
  auVar3 = _DAT_0014c360;
  auVar2 = _DAT_0014bb30;
  auVar1 = _DAT_0014bb20;
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[9]
       = 0;
  lVar5 = 0;
  do {
    iVar7 = (int)lVar5;
    auVar8._8_4_ = iVar7;
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar9 = (auVar8 | auVar1) ^ auVar2;
    if (auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7ffffff6) {
      local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5] = iVar7;
      local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5 + 1] = iVar7 + 1;
    }
    auVar8 = (auVar8 | auVar3) ^ auVar2;
    if (auVar8._4_4_ == -0x80000000 && auVar8._0_4_ < -0x7ffffff6) {
      local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5 + 2] = iVar7 + 2;
      local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5 + 3] = iVar7 + 3;
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0xc);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  memory::
  Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>::
  Array<std::allocator<int>>(local_50,&local_70);
  if (local_40 != 0) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      testing::internal::CmpHelperEQ<int,int>
                (local_80,"v[i]","hv[i]",
                 (int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar5),
                 (int *)((long)local_48 + lVar5));
      if (local_80[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_88);
        message = "";
        if (local_78.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((local_78.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
                   ,0x38,message);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (((local_88.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
           (local_88.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_88.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 4;
    } while (uVar6 < local_40);
  }
  if (local_48 != (void *)0x0) {
    free(local_48);
  }
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(HostVector, move_constructor) {
    using namespace memory;

    // move constructor
    HostVector<float> v1 = HostVector<float>(100);

    EXPECT_EQ(v1.size(), 100);
}